

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.h
# Opt level: O2

void __thiscall SAT::saveCurrentPolarities(SAT *this)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  bool *pbVar4;
  lbool lVar5;
  lbool lVar6;
  uint i;
  ulong uVar7;
  bool bVar8;
  
  lVar6.value = ::l_False.value;
  lVar5.value = ::l_True.value;
  uVar2 = (this->assigns).sz;
  pcVar3 = (this->assigns).data;
  pbVar4 = (this->polarity).data;
  uVar7 = 0;
  do {
    if (uVar2 == uVar7) {
      return;
    }
    cVar1 = pcVar3[uVar7];
    if (lVar5.value == cVar1) {
      bVar8 = false;
LAB_001960a7:
      pbVar4[uVar7] = bVar8;
    }
    else {
      bVar8 = true;
      if (lVar6.value == cVar1) goto LAB_001960a7;
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void saveCurrentPolarities() {
		for (unsigned int i = 0; i < assigns.size(); i++) {
			if (assigns[i] == toInt(l_True)) {
				polarity[i] = false;  // False means to branch 'true' on this SAT variable
			} else if (assigns[i] == toInt(l_False)) {
				polarity[i] = true;  // True means to branch 'false' on this SAT variable
			}
		}
	}